

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O1

RC __thiscall
QO_Manager::IsValidIndexCond
          (QO_Manager *this,int relsJoined,int condIndex,int relIdx,int *attrIndex)

{
  RC RVar1;
  Condition *pCVar2;
  RelAttr attr;
  RelAttr attr_00;
  RelAttr attr_01;
  RelAttr attr_02;
  int firstRel_1;
  int secondRel;
  int firstRel;
  int local_3c;
  uint local_38;
  uint local_34;
  
  pCVar2 = this->conds;
  if (pCVar2[condIndex].bRhsIsAttr == 0) {
    attr_01.attrName = pCVar2[condIndex].lhsAttr.attrName;
    attr_01.relName = pCVar2[condIndex].lhsAttr.relName;
    AttrToRelIndex(this,attr_01,&local_3c);
    if (local_3c == relIdx) {
      attr_02.attrName = this->conds[condIndex].lhsAttr.attrName;
      attr_02.relName = this->conds[condIndex].lhsAttr.relName;
      RVar1 = QL_Manager::GetAttrCatEntryPos(this->qlm,attr_02,attrIndex);
    }
    else {
      RVar1 = 0;
    }
  }
  else {
    attr.attrName = pCVar2[condIndex].lhsAttr.attrName;
    attr.relName = pCVar2[condIndex].lhsAttr.relName;
    AttrToRelIndex(this,attr,(int *)&local_34);
    attr_00.attrName = this->conds[condIndex].rhsAttr.attrName;
    attr_00.relName = this->conds[condIndex].rhsAttr.relName;
    AttrToRelIndex(this,attr_00,(int *)&local_38);
    if (local_38 == relIdx && ((1 << ((byte)local_34 & 0x1f) & relsJoined) != 0 || 0x20 < local_34))
    {
      pCVar2 = (Condition *)&this->conds[condIndex].rhsAttr;
    }
    else {
      if (local_34 != relIdx) {
        return 0;
      }
      if (local_38 < 0x21 && (1 << ((byte)local_38 & 0x1f) & relsJoined) == 0) {
        return 0;
      }
      pCVar2 = this->conds + condIndex;
    }
    RVar1 = QL_Manager::GetAttrCatEntryPos(this->qlm,pCVar2->lhsAttr,attrIndex);
  }
  return RVar1;
}

Assistant:

RC QO_Manager::IsValidIndexCond(int relsJoined, int condIndex, int relIdx, int &attrIndex){
  RC rc = 0;
  // For attr-attr conditions, one attribute must be in relIdx, and another
  // must be in relsJoined
  if(conds[condIndex].bRhsIsAttr){
    int firstRel, secondRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    AttrToRelIndex(conds[condIndex].rhsAttr, secondRel);
    bool firstBitSet = IsBitSet(firstRel, relsJoined);
    bool secondBitSet = IsBitSet(secondRel, relsJoined);
    if(firstBitSet && secondRel == relIdx){
      if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].rhsAttr, attrIndex)))
        return (rc);
      return (0);
    }
    else if(secondBitSet && firstRel == relIdx){
      if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].lhsAttr, attrIndex)))
        return (rc);
      return (0);
    }
  }
  // otherwise, attr-value conditions must have attribute in relIdx
  else{
    int firstRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    if(firstRel == relIdx){
      if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].lhsAttr, attrIndex)))
        return (rc);
      return (0);
    }
  }

  return (rc);
}